

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSAOHDist_NECOF.cpp
# Opt level: O2

string * __thiscall
FSAOHDist_NECOF::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,FSAOHDist_NECOF *this)

{
  pointer pvVar1;
  double *pdVar2;
  ostream *poVar3;
  const_reference ppCVar4;
  double *pdVar5;
  pointer pvVar6;
  uint uVar7;
  stringstream ss_1;
  stringstream ss;
  stringstream ss_2;
  string local_6d0 [32];
  string local_6b0 [32];
  string local_690 [32];
  string local_670 [32];
  stringstream local_650 [16];
  ostream local_640 [376];
  stringstream local_4c8 [16];
  ostream local_4b8 [376];
  stringstream local_340 [392];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_4c8);
  poVar3 = std::operator<<(local_4b8,"Nearly completely factored (S,OH)-distribution:");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar3,"state factor marginals=");
  std::endl<char,std::char_traits<char>>(poVar3);
  (*(this->_m_sfacMarginals->super_FactoredStateDistribution).super_StateDistribution.
    _vptr_StateDistribution[6])(local_6b0);
  poVar3 = std::operator<<(local_4b8,local_6b0);
  poVar3 = std::operator<<(poVar3,"oHist marginals=");
  std::__cxx11::stringstream::stringstream(local_650);
  pvVar1 = (this->_m_oHistMarginals).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar6 = (this->_m_oHistMarginals).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::operator<<(local_640,"< ");
  for (; pvVar6 != pvVar1; pvVar6 = pvVar6 + 1) {
    if (pvVar6 != (this->_m_oHistMarginals).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      std::operator<<(local_640,", ");
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    pdVar5 = (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    std::operator<<(local_1a8,"< ");
    for (; pdVar5 != pdVar2; pdVar5 = pdVar5 + 1) {
      if (pdVar5 != (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start) {
        std::operator<<(local_1a8,", ");
      }
      std::__cxx11::stringstream::stringstream(local_340);
      std::ostream::_M_insert<double>(*pdVar5);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_340);
      std::operator<<(local_1a8,local_670);
      std::__cxx11::string::~string(local_670);
    }
    std::operator<<(local_1a8," >");
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::operator<<(local_640,local_690);
    std::__cxx11::string::~string(local_690);
  }
  std::operator<<(local_640," >");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_650);
  poVar3 = std::operator<<(poVar3,local_6d0);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string(local_6d0);
  std::__cxx11::string::~string(local_6b0);
  poVar3 = std::operator<<(local_4b8,"oHist conditionals=");
  std::endl<char,std::char_traits<char>>(poVar3);
  for (uVar7 = 0;
      (ulong)uVar7 <
      (ulong)((long)(this->_m_oHistConditional).
                    super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_m_oHistConditional).
                    super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
    ppCVar4 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::at
                        (&this->_m_oHistConditional,(ulong)uVar7);
    (*(*ppCVar4)->_vptr_CPDDiscreteInterface[7])((string *)local_340);
    poVar3 = std::operator<<(local_4b8,(string *)local_340);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)local_340);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_4c8);
  return __return_storage_ptr__;
}

Assistant:

string FSAOHDist_NECOF::SoftPrint() const
{
    stringstream ss;
    ss << "Nearly completely factored (S,OH)-distribution:"<<endl
        << "state factor marginals="<<endl;
    ss << _m_sfacMarginals->SoftPrint() 
       << "oHist marginals="<< SoftPrintVector(_m_oHistMarginals) << endl;
    ss << "oHist conditionals=" << endl;
//     <<     "Not printed"<< endl <<
    for(Index agI=0; agI < _m_oHistConditional.size(); agI++)        
        ss <<  _m_oHistConditional.at(agI)->SoftPrint() << endl;
    return (ss.str() );

}